

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::csharp::ToCSharpName
                   (string *__return_storage_ptr__,string *name,FileDescriptor *file)

{
  bool bVar1;
  allocator local_c2;
  allocator local_c1;
  string local_c0;
  string classname;
  string result;
  string local_60;
  string local_40;
  
  GetFileNamespace_abi_cxx11_(&result,(csharp *)file,file);
  bVar1 = std::operator!=(&result,"");
  if (bVar1) {
    std::__cxx11::string::push_back((char)&result);
  }
  classname._M_dataplus._M_p = (pointer)&classname.field_2;
  classname._M_string_length = 0;
  classname.field_2._M_local_buf[0] = '\0';
  if (*(long *)(*(long *)(file + 8) + 8) == 0) {
    std::__cxx11::string::_M_assign((string *)&classname);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)name);
    std::__cxx11::string::operator=((string *)&classname,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::__cxx11::string::string((string *)&local_40,".",&local_c1);
  std::__cxx11::string::string((string *)&local_60,".Types.",&local_c2);
  StringReplace(&local_c0,&classname,&local_40,&local_60,true);
  std::__cxx11::string::append((string *)&result);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+(__return_storage_ptr__,"global::",&result);
  std::__cxx11::string::~string((string *)&classname);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string ToCSharpName(const std::string& name, const FileDescriptor* file) {
  std::string result = GetFileNamespace(file);
  if (result != "") {
    result += '.';
  }
  string classname;
  if (file->package().empty()) {
    classname = name;
  } else {
    // Strip the proto package from full_name since we've replaced it with
    // the C# namespace.
    classname = name.substr(file->package().size() + 1);
  }
  result += StringReplace(classname, ".", ".Types.", true);
  return "global::" + result;
}